

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call.hpp
# Opt level: O2

function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> * __thiscall
chaiscript::dispatch::functor<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>
          (function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>
           *__return_storage_ptr__,dispatch *this,Boxed_Value *bv,
          Type_Conversions_State *t_conversions)

{
  chaiscript acStack_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>
            (acStack_28,(Boxed_Value *)this,(Type_Conversions_State *)bv);
  functor<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>
            (__return_storage_ptr__,(dispatch *)acStack_28,(Const_Proxy_Function *)bv,t_conversions)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::function<FunctionType> functor(const Boxed_Value &bv, const Type_Conversions_State *t_conversions) {
      return functor<FunctionType>(boxed_cast<Const_Proxy_Function>(bv, t_conversions), t_conversions);
    }